

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O3

void RegisterParameter(UnityAudioEffectDefinition *definition,char *name,char *unit,float minval,
                      float maxval,float defaultval,float displayscale,float displayexponent,
                      int enumvalue,char *description)

{
  UnityAudioParameterDefinition *pUVar1;
  char *pcVar2;
  
  if (defaultval < minval) {
    __assert_fail("defaultval >= minval",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginUtil.cpp"
                  ,0x147,
                  "void RegisterParameter(UnityAudioEffectDefinition &, const char *, const char *, float, float, float, float, float, int, const char *)"
                 );
  }
  if (defaultval <= maxval) {
    strcpy(definition->paramdefs[enumvalue].name,name);
    strcpy(definition->paramdefs[enumvalue].unit,unit);
    if ((description == (char *)0x0) && (description = name, name == (char *)0x0)) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = strnew(description);
    }
    pUVar1 = definition->paramdefs;
    pUVar1[enumvalue].description = pcVar2;
    pUVar1[enumvalue].defaultval = defaultval;
    pUVar1[enumvalue].displayscale = displayscale;
    pUVar1[enumvalue].displayexponent = displayexponent;
    pUVar1[enumvalue].min = minval;
    pUVar1[enumvalue].max = maxval;
    if ((int)definition->numparameters <= enumvalue) {
      definition->numparameters = enumvalue + 1;
    }
    return;
  }
  __assert_fail("defaultval <= maxval",
                "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginUtil.cpp"
                ,0x148,
                "void RegisterParameter(UnityAudioEffectDefinition &, const char *, const char *, float, float, float, float, float, int, const char *)"
               );
}

Assistant:

void RegisterParameter(
    UnityAudioEffectDefinition& definition,
    const char* name,
    const char* unit,
    float minval,
    float maxval,
    float defaultval,
    float displayscale,
    float displayexponent,
    int enumvalue,
    const char* description
    )
{
    assert(defaultval >= minval);
    assert(defaultval <= maxval);
    strcpy_s(definition.paramdefs[enumvalue].name, name);
    strcpy_s(definition.paramdefs[enumvalue].unit, unit);
    definition.paramdefs[enumvalue].description = (description != NULL) ? strnew(description) : (name != NULL) ? strnew(name) : NULL;
    definition.paramdefs[enumvalue].defaultval = defaultval;
    definition.paramdefs[enumvalue].displayscale = displayscale;
    definition.paramdefs[enumvalue].displayexponent = displayexponent;
    definition.paramdefs[enumvalue].min = minval;
    definition.paramdefs[enumvalue].max = maxval;
    if (enumvalue >= (int)definition.numparameters)
        definition.numparameters = enumvalue + 1;
}